

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int lj_ffh_string_char(lua_State *L)

{
  TValue *pTVar1;
  uint uVar2;
  char *str;
  GCstr *pGVar3;
  ulong uVar4;
  MSize sz;
  
  sz = (MSize)((ulong)((long)L->top - (long)L->base) >> 3);
  str = lj_buf_tmp(L,sz);
  if (0 < (int)sz) {
    uVar4 = 1;
    do {
      uVar2 = lj_lib_checkint(L,(int)uVar4);
      if (0xff < uVar2) {
        lj_err_arg(L,(int)uVar4,LJ_ERR_BADVAL);
      }
      str[uVar4 - 1] = (char)uVar2;
      uVar4 = uVar4 + 1;
    } while (sz + 1 != uVar4);
  }
  pTVar1 = L->base;
  pGVar3 = lj_str_new(L,str,(long)(int)sz);
  pTVar1[-2].u64 = (ulong)pGVar3 | 0xfffd800000000000;
  return 2;
}

Assistant:

LJLIB_ASM(string_char)		LJLIB_REC(.)
{
  int i, nargs = (int)(L->top - L->base);
  char *buf = lj_buf_tmp(L, (MSize)nargs);
  for (i = 1; i <= nargs; i++) {
    int32_t k = lj_lib_checkint(L, i);
    if (!checku8(k))
      lj_err_arg(L, i, LJ_ERR_BADVAL);
    buf[i-1] = (char)k;
  }
  setstrV(L, L->base-1-LJ_FR2, lj_str_new(L, buf, (size_t)nargs));
  return FFH_RES(1);
}